

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void do_show_save_dialog_proc(Am_Object *param_1)

{
  ushort uVar1;
  ulong uVar2;
  Am_Object *pAVar3;
  Am_Value *pAVar4;
  Am_String *pAVar5;
  Am_Value_List *this;
  Am_Wrapper *pAVar6;
  Am_Constraint *pAVar7;
  Am_Method_Wrapper *pAVar8;
  Am_String *local_210;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Value_List local_68 [16];
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object c;
  Am_Object text_label;
  Am_Object local_20;
  Am_Object cancel_button;
  Am_Object save_button;
  Am_Object *param_0_local;
  
  uVar2 = Am_Object::Valid();
  if ((uVar2 & 1) == 0) {
    Am_Object::Am_Object(&cancel_button);
    Am_Object::Am_Object(&local_20);
    Am_Object::Am_Object(&c);
    Am_Object::Am_Object(&local_40);
    Am_Object::Create((char *)&local_48);
    uVar1 = Am_Object::Set((ushort)&local_48,100,3);
    uVar1 = Am_Object::Set(uVar1,0x65,0x19);
    pAVar3 = (Am_Object *)Am_Object::Set(uVar1,0x66,0xbe);
    Am_Object::operator=(&save_dialog_filename,pAVar3);
    Am_Object::~Am_Object(&local_48);
    pAVar4 = (Am_Value *)Am_Object::Get(0x5638,0xc5);
    Am_Object::operator=(&local_40,pAVar4);
    Am_Object::Set((ushort)&local_40,(char *)0x150,0x1113ee);
    Am_Object::Create((char *)&local_50);
    uVar1 = Am_Object::Set((ushort)&local_50,100,7);
    uVar1 = Am_Object::Set(uVar1,0x65,5);
    pAVar3 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x1114b7);
    Am_Object::operator=(&c,pAVar3);
    Am_Object::~Am_Object(&local_50);
    Am_Object::Create((char *)&local_58);
    Am_Value_List::Am_Value_List(local_68);
    pAVar5 = (Am_String *)Am_Value_List::Add((Am_String *)local_68,0x115648,true);
    this = (Am_Value_List *)Am_Value_List::Add(pAVar5,0x115650,true);
    pAVar6 = Am_Value_List::operator_cast_to_Am_Wrapper_(this);
    uVar1 = Am_Object::Set((ushort)&local_58,(Am_Wrapper *)0xa2,(ulong)pAVar6);
    pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Vertical_Layout);
    uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x94,(ulong)pAVar7);
    uVar1 = Am_Object::Set(uVar1,100,8);
    pAVar3 = (Am_Object *)Am_Object::Set(uVar1,0x65,0x2d);
    Am_Object::operator=(&save_dialog_format,pAVar3);
    Am_Value_List::~Am_Value_List(local_68);
    Am_Object::~Am_Object(&local_58);
    Am_Object::Create((char *)&local_70);
    uVar1 = Am_Object::Set((ushort)&local_70,100,5);
    uVar1 = Am_Object::Set(uVar1,0x65,100);
    pAVar3 = (Am_Object *)Am_Object::Set(uVar1,0x66,0x5c);
    Am_Object::operator=(&cancel_button,pAVar3);
    Am_Object::~Am_Object(&local_70);
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)&cancel_button,0xc5);
    Am_Object::operator=(&local_40,pAVar4);
    uVar1 = Am_Object::Set((ushort)&local_40,(char *)0x150,0x1115af);
    pAVar8 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_save_file);
    Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pAVar8);
    Am_Object::Create((char *)&local_78);
    uVar1 = Am_Object::Set((ushort)&local_78,100,0x66);
    uVar1 = Am_Object::Set(uVar1,0x65,100);
    pAVar3 = (Am_Object *)Am_Object::Set(uVar1,0x66,0x5c);
    Am_Object::operator=(&local_20,pAVar3);
    Am_Object::~Am_Object(&local_78);
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)&local_20,0xc5);
    Am_Object::operator=(&local_40,pAVar4);
    uVar1 = Am_Object::Set((ushort)&local_40,(char *)0x150,0x11153d);
    pAVar8 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_hide_dialog);
    Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pAVar8);
    Am_Object::Create((char *)&local_80);
    uVar1 = Am_Object::Set((ushort)&local_80,100,100);
    uVar1 = Am_Object::Set(uVar1,0x65,100);
    uVar1 = Am_Object::Set(uVar1,0x66,200);
    uVar1 = Am_Object::Set(uVar1,0x67,0x8c);
    uVar1 = Am_Object::Set(uVar1,(char *)0x6c,0x111550);
    uVar1 = Am_Object::Set(uVar1,(char *)0x6d,0x111550);
    pAVar6 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Amulet_Purple);
    uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar6);
    pAVar3 = (Am_Object *)Am_Object::Set(uVar1,true,0);
    Am_Object::Am_Object(&local_88,(Am_Object *)&c);
    pAVar3 = (Am_Object *)Am_Object::Add_Part(pAVar3,SUB81(&local_88,0),1);
    Am_Object::Am_Object(&local_90,(Am_Object *)&save_dialog_filename);
    pAVar3 = (Am_Object *)Am_Object::Add_Part(pAVar3,SUB81(&local_90,0),1);
    Am_Object::Am_Object(&local_98,(Am_Object *)&save_dialog_format);
    pAVar3 = (Am_Object *)Am_Object::Add_Part(pAVar3,SUB81(&local_98,0),1);
    Am_Object::Am_Object(&local_a0,(Am_Object *)&cancel_button);
    pAVar3 = (Am_Object *)Am_Object::Add_Part(pAVar3,SUB81(&local_a0,0),1);
    Am_Object::Am_Object(&local_a8,(Am_Object *)&local_20);
    pAVar3 = (Am_Object *)Am_Object::Add_Part(pAVar3,SUB81(&local_a8,0),1);
    Am_Object::operator=(&save_dialog,pAVar3);
    Am_Object::~Am_Object(&local_a8);
    Am_Object::~Am_Object(&local_a0);
    Am_Object::~Am_Object(&local_98);
    Am_Object::~Am_Object(&local_90);
    Am_Object::~Am_Object(&local_88);
    Am_Object::~Am_Object(&local_80);
    Am_Object::Am_Object(&local_b0,(Am_Object *)&save_dialog);
    Am_Object::Add_Part((Am_Object *)&Am_Screen,SUB81(&local_b0,0),1);
    Am_Object::~Am_Object(&local_b0);
    Am_Object::~Am_Object(&local_40);
    Am_Object::~Am_Object(&c);
    Am_Object::~Am_Object(&local_20);
    Am_Object::~Am_Object(&cancel_button);
  }
  Am_Object::Set(0x5638,(Am_String *)0x169,0x115588);
  if ((save_with_examples & 1U) == 0) {
    local_210 = &classifier_only;
  }
  else {
    local_210 = &classifier_and_examples;
  }
  Am_Object::Set(0x5640,(Am_String *)0x169,(ulong)local_210);
  Am_Object::Am_Object(&local_b8,(Am_Object *)&save_dialog);
  Am_Object::Am_Object(&local_c0,(Am_Object *)&window);
  Show_Dialog_Centered(&local_b8,&local_c0);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_b8);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_show_save_dialog,
                 (Am_Object /*cmd*/))
{
  if (!save_dialog.Valid()) {
    Am_Object save_button, cancel_button, text_label;
    Am_Object c;
    save_dialog_filename = Am_Text_Input_Widget.Create("save_dialog_filename")
                               .Set(Am_LEFT, 3)
                               .Set(Am_TOP, 25)
                               .Set(Am_WIDTH, 190);
    c = save_dialog_filename.Get(Am_COMMAND);
    c.Set(Am_LABEL, "")
        //.Set(Am_DO_METHOD, do_save_file)
        ;
    text_label = Am_Text.Create("save_dialog_label")
                     .Set(Am_LEFT, 7)
                     .Set(Am_TOP, 5)
                     .Set(Am_TEXT, "Filename:");
    save_dialog_format = Am_Radio_Button_Panel.Create("save_dialog_format")
                             .Set(Am_ITEMS, Am_Value_List()
                                                .Add(classifier_and_examples)
                                                .Add(classifier_only))
                             .Set(Am_LAYOUT, Am_Vertical_Layout)
                             .Set(Am_LEFT, 8)
                             .Set(Am_TOP, 45);
    save_button = Am_Button.Create("save_dialog_save_button")
                      .Set(Am_LEFT, 5)
                      .Set(Am_TOP, 100)
                      .Set(Am_WIDTH, 92);
    c = save_button.Get(Am_COMMAND);
    c.Set(Am_LABEL, "Save").Set(Am_DO_METHOD, do_save_file);
    cancel_button = Am_Button.Create("save_dialog_cancel_button")
                        .Set(Am_LEFT, 102)
                        .Set(Am_TOP, 100)
                        .Set(Am_WIDTH, 92);
    c = cancel_button.Get(Am_COMMAND);
    c.Set(Am_LABEL, "Cancel").Set(Am_DO_METHOD, do_hide_dialog);
    save_dialog = Am_Window.Create("save_dialog")
                      .Set(Am_LEFT, 100)
                      .Set(Am_TOP, 100)
                      .Set(Am_WIDTH, 200)
                      .Set(Am_HEIGHT, 140)
                      .Set(Am_TITLE, "Save Classifier")
                      .Set(Am_ICON_TITLE, "Save Classifier")
                      .Set(Am_FILL_STYLE, Am_Amulet_Purple)
                      .Set(Am_VISIBLE, false)
                      .Add_Part(text_label)
                      .Add_Part(save_dialog_filename)
                      .Add_Part(save_dialog_format)
                      .Add_Part(save_button)
                      .Add_Part(cancel_button);
    Am_Screen.Add_Part(save_dialog);
  }

  // save the current filename
  save_dialog_filename.Set(Am_VALUE, current_filename);
  save_dialog_format.Set(Am_VALUE, save_with_examples ? classifier_and_examples
                                                      : classifier_only);

  Show_Dialog_Centered(save_dialog, window);
}